

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::
initialize<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>
          (optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>> *this,
          Animatable<tinyusdz::value::texcoord2f> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>)0x1) {
    tinyusdz::Animatable<tinyusdz::value::texcoord2f>::Animatable
              ((Animatable<tinyusdz::value::texcoord2f> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::value::texcoord2f>, V = tinyusdz::Animatable<tinyusdz::value::texcoord2f>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }